

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::GenerateMessageSerializationMethods
          (MessageGenerator *this,Printer *printer)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar4;
  size_type sVar5;
  const_reference ppFVar6;
  FieldGeneratorBase *pFVar7;
  FieldDescriptor *descriptor;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_40;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator_1;
  int i_1;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> local_28;
  scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase> generator;
  int i;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public void WriteTo(pb::CodedOutputStream output) {\n");
  io::Printer::Indent(printer);
  generator.ptr_._4_4_ = 0;
  while( true ) {
    uVar3 = (ulong)generator.ptr_._4_4_;
    pvVar4 = fields_by_number(this);
    sVar5 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::size(pvVar4);
    if (sVar5 <= uVar3) break;
    pvVar4 = fields_by_number(this);
    ppFVar6 = std::
              vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ::operator[](pvVar4,(long)generator.ptr_._4_4_);
    pFVar7 = CreateFieldGeneratorInternal(this,*ppFVar6);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
              (&local_28,pFVar7);
    pFVar7 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&local_28);
    (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[8])(pFVar7,printer);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
              (&local_28);
    generator.ptr_._4_4_ = generator.ptr_._4_4_ + 1;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,"public int CalculateSize() {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int size = 0;\n");
  generator_1.ptr_._0_4_ = 0;
  while( true ) {
    iVar1 = (int)generator_1.ptr_;
    iVar2 = Descriptor::field_count(this->descriptor_);
    if (iVar2 <= iVar1) break;
    descriptor = Descriptor::field(this->descriptor_,(int)generator_1.ptr_);
    pFVar7 = CreateFieldGeneratorInternal(this,descriptor);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::scoped_ptr
              (&local_40,pFVar7);
    pFVar7 = internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::
             operator->(&local_40);
    (*(pFVar7->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[9])(pFVar7,printer);
    internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::~scoped_ptr
              (&local_40);
    generator_1.ptr_._0_4_ = (int)generator_1.ptr_ + 1;
  }
  io::Printer::Print(printer,"return size;\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n\n");
  return;
}

Assistant:

void MessageGenerator::GenerateMessageSerializationMethods(io::Printer* printer) {
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
      "public void WriteTo(pb::CodedOutputStream output) {\n");
  printer->Indent();

  // Serialize all the fields
  for (int i = 0; i < fields_by_number().size(); i++) {
    scoped_ptr<FieldGeneratorBase> generator(
      CreateFieldGeneratorInternal(fields_by_number()[i]));
    generator->GenerateSerializationCode(printer);
  }

  // TODO(jonskeet): Memoize size of frozen messages?
  printer->Outdent();
  printer->Print(
	"}\n"
	"\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    "public int CalculateSize() {\n");
  printer->Indent();
  printer->Print("int size = 0;\n");
  for (int i = 0; i < descriptor_->field_count(); i++) {
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(descriptor_->field(i)));
    generator->GenerateSerializedSizeCode(printer);
  }
  printer->Print("return size;\n");
  printer->Outdent();
  printer->Print("}\n\n");
}